

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zfio.c
# Opt level: O1

zfp * zfopen(char *path,char *mode)

{
  bool bVar1;
  int iVar2;
  zfp *__ptr;
  FILE *__stream;
  size_t sVar3;
  undefined4 extraout_var;
  zfp *pzVar4;
  gzFile pgVar5;
  char path2 [1024];
  char local_428;
  char local_427;
  
  __ptr = (zfp *)malloc(0x10);
  if (__ptr != (zfp *)0x0) {
    __ptr->fp = (FILE *)0x0;
    __ptr->gz = (gzFile)0x0;
    if ((*mode != 'z') && (mode[1] != 'z')) {
      __stream = fopen(path,mode);
      __ptr->fp = (FILE *)__stream;
      if (__stream != (FILE *)0x0) {
        sVar3 = fread(&local_428,1,2,__stream);
        if (sVar3 == 2) {
          if ((local_428 == '\x1f') && (local_427 == -0x75)) {
            iVar2 = fclose(__stream);
            __ptr->fp = (FILE *)0x0;
            bVar1 = true;
            pzVar4 = (zfp *)CONCAT44(extraout_var,iVar2);
          }
          else {
            bVar1 = false;
            fseeko(__stream,0,0);
            pzVar4 = __ptr;
          }
        }
        else {
          free(__ptr);
          pzVar4 = (zfp *)0x0;
          bVar1 = false;
        }
        if (!bVar1) {
          return pzVar4;
        }
      }
    }
    pgVar5 = (gzFile)gzopen(path,mode);
    __ptr->gz = pgVar5;
    if (pgVar5 != (gzFile)0x0) {
      return __ptr;
    }
    sprintf(&local_428,"%.*s.gz",0x3fc,path);
    pgVar5 = (gzFile)gzopen(&local_428,mode);
    __ptr->gz = pgVar5;
    if (pgVar5 != (gzFile)0x0) {
      return __ptr;
    }
    perror(path);
    free(__ptr);
  }
  return (zfp *)0x0;
}

Assistant:

zfp *zfopen(const char *path, const char *mode) {
    char path2[1024];
    zfp *zf;

    if (!(zf = (zfp *)malloc(sizeof(*zf))))
	return NULL;
    zf->fp = NULL;
    zf->gz = NULL;

    /* Try normal fopen */
    if (mode[0] != 'z' && mode[1] != 'z' &&
	NULL != (zf->fp = fopen(path, mode))) {
	unsigned char magic[2];
	if (2 != fread(magic, 1, 2, zf->fp)) {
	    free(zf);
	    return NULL;
	}
	if (!(magic[0] == 0x1f &&
	      magic[1] == 0x8b)) {
	    fseeko(zf->fp, 0, SEEK_SET);
	    return zf;
	}

	fclose(zf->fp);
	zf->fp = NULL;
    }

#ifdef HAVE_POPEN
    /*
     * I've no idea why, by gzgets is VERY slow, maybe because it handles
     * arbitrary seeks.
     * popen to gzip -cd is 3 times faster though.
     */
    if (*mode == 'w') {
    } else {
	if (access(path, R_OK) == 0) {
	    sprintf(path2, "gzip -cd < %.*s", 1000, path);
	    if (NULL != (zf->fp = popen(path2, "r")))
		return zf;
	}
	
	sprintf(path2, "gzip -cd < %.*s.gz", 1000, path);
	if (NULL != (zf->fp = popen(path2, "r")))
	    return zf;

	printf("Failed on %s\n", path);
    } else {
	sprintf(path2, "gzip > %.*s", 1000, path);
	if (NULL != (zf->fp = popen(path2, "w")))
	    return zf;
	}
	
	printf("Failed on %s\n", path);
    }
#else
    /* Gzopen instead */
    if ((zf->gz = gzopen(path, mode)))
	return zf;

    sprintf(path2, "%.*s.gz", 1020, path);
    if ((zf->gz = gzopen(path2, mode)))
	return zf;
#endif

    perror(path);

    free(zf);
    return NULL;
}